

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

void crnlib::MatchFinder_Normalize3(UInt32 subValue,CLzRef *items,UInt32 numItems)

{
  ulong uVar1;
  CLzRef CVar2;
  
  if (numItems != 0) {
    uVar1 = 0;
    do {
      CVar2 = items[uVar1] - subValue;
      if (items[uVar1] < subValue) {
        CVar2 = 0;
      }
      items[uVar1] = CVar2;
      uVar1 = uVar1 + 1;
    } while (numItems != uVar1);
  }
  return;
}

Assistant:

void MatchFinder_Normalize3(UInt32 subValue, CLzRef* items, UInt32 numItems) {
  UInt32 i;
  for (i = 0; i < numItems; i++) {
    UInt32 value = items[i];
    if (value <= subValue)
      value = kEmptyHashValue;
    else
      value -= subValue;
    items[i] = value;
  }
}